

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::NameMunger::AddRegex(NameMunger *this,string *regex,string *replacement)

{
  value_type *in_RDI;
  __single_object reg;
  pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  
  this_00 = (pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffffe0;
  std::make_unique<bloaty::ReImpl,std::__cxx11::string_const&>(in_stack_ffffffffffffffb8);
  std::
  make_pair<std::unique_ptr<bloaty::ReImpl,std::default_delete<bloaty::ReImpl>>,std::__cxx11::string_const&>
            (in_stack_ffffffffffffffa8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::
  vector<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_00,in_RDI);
  std::
  pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(this_00);
  std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
            (&this_00->first);
  return;
}

Assistant:

void NameMunger::AddRegex(const std::string& regex,
                          const std::string& replacement) {
  auto reg = absl::make_unique<ReImpl>(regex);
  regexes_.push_back(std::make_pair(std::move(reg), replacement));
}